

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O1

xmlChar * xmlBuildRelativeURI(xmlChar *URI,xmlChar *base)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  xmlURIPtr uri;
  xmlChar *pxVar7;
  xmlURIPtr uri_00;
  char *pcVar8;
  xmlChar *str;
  long lVar9;
  long lVar10;
  char *pcVar11;
  bool bVar12;
  xmlChar *local_38;
  
  if ((URI == (xmlChar *)0x0) || (*URI == '\0')) {
    return (xmlChar *)0x0;
  }
  uri = (xmlURIPtr)(*xmlMalloc)(0x58);
  if (uri == (xmlURIPtr)0x0) {
    xmlURIErrMemory("creating URI structure\n");
    uri = (xmlURIPtr)0x0;
  }
  else {
    uri->fragment = (char *)0x0;
    *(undefined8 *)&uri->cleanup = 0;
    uri->path = (char *)0x0;
    uri->query = (char *)0x0;
    uri->user = (char *)0x0;
    *(undefined8 *)&uri->port = 0;
    uri->authority = (char *)0x0;
    uri->server = (char *)0x0;
    uri->scheme = (char *)0x0;
    uri->opaque = (char *)0x0;
    uri->query_raw = (char *)0x0;
  }
  if (uri == (xmlURIPtr)0x0) {
    return (xmlChar *)0x0;
  }
  if (*URI == '.') {
    pxVar7 = xmlStrdup(URI);
    uri->path = (char *)pxVar7;
LAB_0018d2c6:
    if ((base == (xmlChar *)0x0) || (*base == '\0')) {
      pxVar7 = xmlStrdup(URI);
      goto LAB_0018d30e;
    }
    uri_00 = (xmlURIPtr)(*xmlMalloc)(0x58);
    if (uri_00 == (xmlURIPtr)0x0) {
      xmlURIErrMemory("creating URI structure\n");
      uri_00 = (xmlURIPtr)0x0;
    }
    else {
      uri_00->fragment = (char *)0x0;
      *(undefined8 *)&uri_00->cleanup = 0;
      uri_00->path = (char *)0x0;
      uri_00->query = (char *)0x0;
      uri_00->user = (char *)0x0;
      *(undefined8 *)&uri_00->port = 0;
      uri_00->authority = (char *)0x0;
      uri_00->server = (char *)0x0;
      uri_00->scheme = (char *)0x0;
      uri_00->opaque = (char *)0x0;
      uri_00->query_raw = (char *)0x0;
    }
    bVar12 = false;
    if (uri_00 == (xmlURIPtr)0x0) {
      pxVar7 = (xmlChar *)0x0;
      uri_00 = (xmlURIPtr)0x0;
      bVar12 = false;
      goto LAB_0018d313;
    }
    if (*base == '.') {
      pxVar7 = xmlStrdup(base);
      uri_00->path = (char *)pxVar7;
LAB_0018d384:
      if (((xmlChar *)uri->scheme == (xmlChar *)0x0) ||
         ((((xmlChar *)uri_00->scheme != (xmlChar *)0x0 &&
           (iVar5 = xmlStrcmp((xmlChar *)uri_00->scheme,(xmlChar *)uri->scheme), iVar5 == 0)) &&
          (iVar5 = xmlStrcmp((xmlChar *)uri_00->server,(xmlChar *)uri->server), iVar5 == 0)))) {
        iVar5 = xmlStrEqual((xmlChar *)uri_00->path,(xmlChar *)uri->path);
        if (iVar5 == 0) {
          URI = (xmlChar *)uri->path;
          if (uri_00->path != (char *)0x0) {
            bVar12 = URI == (xmlChar *)0x0;
            if (bVar12) {
              uri->path = "/";
            }
            pcVar8 = uri_00->path;
            pcVar11 = uri->path;
            if (*pcVar11 == '.') {
              pcVar11 = pcVar11 + (ulong)(pcVar11[1] == '/') * 2;
            }
            if (*pcVar8 == '/') {
              pcVar8 = pcVar8 + (*pcVar11 != '/');
            }
            else if ((*pcVar8 == '.') && (pcVar8[1] == '/')) {
              pcVar8 = pcVar8 + 2;
            }
            lVar9 = 0;
            do {
              cVar2 = pcVar8[lVar9];
              pcVar1 = pcVar11 + lVar9;
              lVar9 = lVar9 + 1;
              if (cVar2 == '\0') break;
            } while (cVar2 == *pcVar1);
            if (cVar2 != *pcVar1) {
              do {
                lVar10 = lVar9 + -1;
                iVar5 = 0;
                if (lVar10 < 1) {
                  lVar10 = 0;
                  break;
                }
                lVar4 = lVar9 + -2;
                lVar9 = lVar10;
              } while (pcVar11[lVar4] != '/');
              lVar9 = (long)(int)lVar10;
              pcVar8 = pcVar8 + lVar9;
              do {
                if (*pcVar8 == '/') {
                  iVar5 = iVar5 + 1;
                }
                else if (*pcVar8 == '\0') goto LAB_0018d4a3;
                pcVar8 = pcVar8 + 1;
              } while( true );
            }
            pxVar7 = xmlStrdup("");
            iVar6 = (int)lVar9;
            goto LAB_0018d469;
          }
        }
        else {
          URI = "";
        }
      }
      pxVar7 = xmlStrdup(URI);
      goto LAB_0018d313;
    }
    iVar5 = xmlParse3986URIReference(uri_00,(char *)base);
    if (iVar5 == 0) goto LAB_0018d384;
    pxVar7 = (xmlChar *)0x0;
  }
  else {
    iVar5 = xmlParse3986URIReference(uri,(char *)URI);
    if (iVar5 == 0) goto LAB_0018d2c6;
    pxVar7 = (xmlChar *)0x0;
LAB_0018d30e:
    uri_00 = (xmlURIPtr)0x0;
  }
  bVar12 = false;
LAB_0018d313:
  if (bVar12) {
    uri->path = (char *)0x0;
  }
  xmlFreeURI(uri);
  if (uri_00 != (xmlURIPtr)0x0) {
    xmlFreeURI(uri_00);
    return pxVar7;
  }
  return pxVar7;
LAB_0018d4a3:
  local_38 = (xmlChar *)(pcVar11 + lVar9);
  if ((iVar5 == 0) && (*local_38 == '\0')) {
    pxVar7 = xmlStrdup((xmlChar *)"./");
    iVar6 = (int)lVar9;
LAB_0018d469:
    iVar5 = 0;
    bVar3 = false;
  }
  else {
    iVar6 = xmlStrlen(local_38);
    iVar6 = iVar6 + 1;
    bVar3 = true;
    pxVar7 = (xmlChar *)0x0;
  }
  if (bVar3) {
    if (iVar5 == 0) {
      if (local_38 != (xmlChar *)0x0) {
        pxVar7 = xmlURIEscapeStr(local_38,(xmlChar *)"/;&=+$,");
      }
    }
    else {
      str = (xmlChar *)(*xmlMalloc)((long)(iVar5 * 3 + iVar6));
      if (str == (xmlChar *)0x0) {
        xmlURIErrMemory("building relative URI\n");
        pxVar7 = (xmlChar *)0x0;
      }
      else {
        pxVar7 = str;
        if (0 < iVar5) {
          iVar5 = iVar5 + 1;
          do {
            pxVar7[0] = '.';
            pxVar7[1] = '.';
            pxVar7[2] = '/';
            pxVar7 = pxVar7 + 3;
            iVar5 = iVar5 + -1;
          } while (1 < iVar5);
        }
        iVar5 = -1;
        if (local_38 != (xmlChar *)0x0) {
          if (((iVar6 < 1 || pxVar7 <= str) || (*local_38 != '/')) || (pxVar7[-1] != '/')) {
            memcpy(pxVar7,local_38,(long)iVar6);
          }
          else {
            memcpy(pxVar7,local_38 + 1,(ulong)(iVar6 - 1));
            iVar5 = -2;
          }
        }
        pxVar7[iVar6 + iVar5] = '\0';
        pxVar7 = xmlURIEscapeStr(str,(xmlChar *)"/;&=+$,");
        (*xmlFree)(str);
      }
    }
  }
  goto LAB_0018d313;
}

Assistant:

xmlChar *
xmlBuildRelativeURI (const xmlChar * URI, const xmlChar * base)
{
    xmlChar *val = NULL;
    int ret;
    int ix;
    int nbslash = 0;
    int len;
    xmlURIPtr ref = NULL;
    xmlURIPtr bas = NULL;
    xmlChar *bptr, *uptr, *vptr;
    int remove_path = 0;

    if ((URI == NULL) || (*URI == 0))
	return NULL;

    /*
     * First parse URI into a standard form
     */
    ref = xmlCreateURI ();
    if (ref == NULL)
	return NULL;
    /* If URI not already in "relative" form */
    if (URI[0] != '.') {
	ret = xmlParseURIReference (ref, (const char *) URI);
	if (ret != 0)
	    goto done;		/* Error in URI, return NULL */
    } else
	ref->path = (char *)xmlStrdup(URI);

    /*
     * Next parse base into the same standard form
     */
    if ((base == NULL) || (*base == 0)) {
	val = xmlStrdup (URI);
	goto done;
    }
    bas = xmlCreateURI ();
    if (bas == NULL)
	goto done;
    if (base[0] != '.') {
	ret = xmlParseURIReference (bas, (const char *) base);
	if (ret != 0)
	    goto done;		/* Error in base, return NULL */
    } else
	bas->path = (char *)xmlStrdup(base);

    /*
     * If the scheme / server on the URI differs from the base,
     * just return the URI
     */
    if ((ref->scheme != NULL) &&
	((bas->scheme == NULL) ||
	 (xmlStrcmp ((xmlChar *)bas->scheme, (xmlChar *)ref->scheme)) ||
	 (xmlStrcmp ((xmlChar *)bas->server, (xmlChar *)ref->server)))) {
	val = xmlStrdup (URI);
	goto done;
    }
    if (xmlStrEqual((xmlChar *)bas->path, (xmlChar *)ref->path)) {
	val = xmlStrdup(BAD_CAST "");
	goto done;
    }
    if (bas->path == NULL) {
	val = xmlStrdup((xmlChar *)ref->path);
	goto done;
    }
    if (ref->path == NULL) {
        ref->path = (char *) "/";
	remove_path = 1;
    }

    /*
     * At this point (at last!) we can compare the two paths
     *
     * First we take care of the special case where either of the
     * two path components may be missing (bug 316224)
     */
    bptr = (xmlChar *)bas->path;
    {
        xmlChar *rptr = (xmlChar *) ref->path;
        int pos = 0;

        /*
         * Next we compare the two strings and find where they first differ
         */
	if ((*rptr == '.') && (rptr[1] == '/'))
            rptr += 2;
	if ((*bptr == '.') && (bptr[1] == '/'))
            bptr += 2;
	else if ((*bptr == '/') && (*rptr != '/'))
	    bptr++;
	while ((bptr[pos] == rptr[pos]) && (bptr[pos] != 0))
	    pos++;

	if (bptr[pos] == rptr[pos]) {
	    val = xmlStrdup(BAD_CAST "");
	    goto done;		/* (I can't imagine why anyone would do this) */
	}

	/*
	 * In URI, "back up" to the last '/' encountered.  This will be the
	 * beginning of the "unique" suffix of URI
	 */
	ix = pos;
	for (; ix > 0; ix--) {
	    if (rptr[ix - 1] == '/')
		break;
	}
	uptr = (xmlChar *)&rptr[ix];

	/*
	 * In base, count the number of '/' from the differing point
	 */
	for (; bptr[ix] != 0; ix++) {
	    if (bptr[ix] == '/')
		nbslash++;
	}

	/*
	 * e.g: URI="foo/" base="foo/bar" -> "./"
	 */
	if (nbslash == 0 && !uptr[0]) {
	    val = xmlStrdup(BAD_CAST "./");
	    goto done;
	}

	len = xmlStrlen (uptr) + 1;
    }

    if (nbslash == 0) {
	if (uptr != NULL)
	    /* exception characters from xmlSaveUri */
	    val = xmlURIEscapeStr(uptr, BAD_CAST "/;&=+$,");
	goto done;
    }

    /*
     * Allocate just enough space for the returned string -
     * length of the remainder of the URI, plus enough space
     * for the "../" groups, plus one for the terminator
     */
    val = (xmlChar *) xmlMalloc (len + 3 * nbslash);
    if (val == NULL) {
        xmlURIErrMemory("building relative URI\n");
	goto done;
    }
    vptr = val;
    /*
     * Put in as many "../" as needed
     */
    for (; nbslash>0; nbslash--) {
	*vptr++ = '.';
	*vptr++ = '.';
	*vptr++ = '/';
    }
    /*
     * Finish up with the end of the URI
     */
    if (uptr != NULL) {
        if ((vptr > val) && (len > 0) &&
	    (uptr[0] == '/') && (vptr[-1] == '/')) {
	    memcpy (vptr, uptr + 1, len - 1);
	    vptr[len - 2] = 0;
	} else {
	    memcpy (vptr, uptr, len);
	    vptr[len - 1] = 0;
	}
    } else {
	vptr[len - 1] = 0;
    }

    /* escape the freshly-built path */
    vptr = val;
	/* exception characters from xmlSaveUri */
    val = xmlURIEscapeStr(vptr, BAD_CAST "/;&=+$,");
    xmlFree(vptr);

done:
    /*
     * Free the working variables
     */
    if (remove_path != 0)
        ref->path = NULL;
    if (ref != NULL)
	xmlFreeURI (ref);
    if (bas != NULL)
	xmlFreeURI (bas);

    return val;
}